

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.hpp
# Opt level: O0

bool tao::pegtl::internal::string<(char)111,(char)102>::
     match<tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>
               (string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *in)

{
  bool bVar1;
  size_t sVar2;
  undefined8 in_RDI;
  undefined6 in_stack_ffffffffffffffd8;
  _Alloc_hider _Var3;
  undefined1 uVar4;
  string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_00;
  size_t in_stack_ffffffffffffffe8;
  
  sVar2 = memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_RDI,in_stack_ffffffffffffffe8);
  if (1 < sVar2) {
    memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::current((memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(in_RDI + 0x20));
    _Var3 = (_Alloc_hider)0x6f;
    uVar4 = 0x66;
    in_00 = (string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&stack0xffffffffffffffde;
    bVar1 = unsafe_equals((char *)in_RDI,(initializer_list<char> *)0x2);
    if (bVar1) {
      bump_help<(tao::pegtl::internal::result_on_found)1,_tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,__o_,__f_>
                (in_00,CONCAT17(uVar4,CONCAT16(_Var3,in_stack_ffffffffffffffd8)));
      return true;
    }
  }
  return false;
}

Assistant:

static bool match( Input& in ) noexcept( noexcept( in.size( 0 ) ) )
            {
               if( in.size( sizeof...( Cs ) ) >= sizeof...( Cs ) ) {
                  if( unsafe_equals( in.current(), { Cs... } ) ) {
                     bump_help< result_on_found::SUCCESS, Input, char, Cs... >( in, sizeof...( Cs ) );
                     return true;
                  }
               }
               return false;
            }